

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_index.h
# Opt level: O1

void __thiscall BufferIndex<double,_long>::index_size(BufferIndex<double,_long> *this)

{
  size_type sVar1;
  leaf_node *plVar2;
  size_t sVar3;
  leaf_node *plVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  unsigned_short uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 in_ZMM0 [64];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar13 [16];
  
  auVar12 = in_ZMM0._0_16_;
  sVar1 = (this->btree).m_stats.leaves;
  lVar6 = sVar1 * 0x10 + ((this->btree).m_stats.innernodes + sVar1) * 0x100 + 0x58;
  lVar10 = ((this->right_buffer).number + (this->left_buffer).number) * 0x10;
  plVar4 = (this->btree).m_headleaf;
  plVar2 = (this->btree).m_tailleaf;
  lVar11 = 0x10000;
  uVar7 = 0;
  while( true ) {
    if (plVar2 == (leaf_node *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = (plVar2->super_node).slotuse;
    }
    if ((plVar2 == plVar4) && ((unsigned_short)uVar7 == uVar8)) break;
    sVar3 = plVar4->slotdata[uVar7]->size;
    lVar11 = lVar11 + sVar3 * 0x10 + 0x8000;
    lVar10 = lVar10 + (sVar3 + (plVar4->slotdata[uVar7]->buffer).number) * 0x10;
    uVar9 = (uint)(plVar4->super_node).slotuse;
    if ((int)uVar7 + 1U < uVar9) {
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x30;
    }
    else {
      uVar7 = (ulong)uVar9;
      if (plVar4->nextleaf != (leaf_node *)0x0) {
        uVar7 = 0;
        plVar4 = plVar4->nextleaf;
      }
      lVar6 = lVar6 + 0x30;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total size: ",0xc);
  auVar12 = vcvtusi2sd_avx512f(auVar12,lVar6 + lVar11);
  poVar5 = std::ostream::_M_insert<double>(auVar12._0_8_ * 9.5367431640625e-07);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," MB",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  auVar14._8_56_ = extraout_var;
  auVar14._0_8_ = extraout_XMM1_Qa;
  auVar12 = auVar14._0_16_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Model size: ",0xc);
  auVar12 = vcvtusi2sd_avx512f(auVar12,lVar6);
  poVar5 = std::ostream::_M_insert<double>(auVar12._0_8_ * 9.5367431640625e-07);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," MB",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  auVar15._8_56_ = extraout_var_00;
  auVar15._0_8_ = extraout_XMM1_Qa_00;
  auVar13 = auVar15._0_16_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Fill rate: ",0xb);
  auVar12 = vcvtusi2sd_avx512f(auVar13,lVar10);
  auVar13 = vcvtusi2sd_avx512f(auVar13,lVar11);
  poVar5 = std::ostream::_M_insert<double>((auVar12._0_8_ * 100.0) / auVar13._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"%",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return;
}

Assistant:

void index_size() const {
        size_t model_size = 0;
        size_t slot_size = 0;
        size_t data_size = 0;
        model_size += sizeof(*this) - 2 * RESERVE * (sizeof(K) + sizeof(P)) + (btree.get_stats().innernodes * btree.get_stats().innerslots + btree.get_stats().leaves * btree.get_stats().leafslots) * (sizeof(K) + sizeof(void*)) + btree.get_stats().leaves * sizeof(void*) * 2;
        slot_size += 2 * RESERVE * (sizeof(K) + sizeof(P));
        data_size += (left_buffer.number + right_buffer.number) * (sizeof(K) + sizeof(P));
        auto it = btree.begin();
        while (it != btree.end()) {
            it->second->node_size(model_size, slot_size, data_size);
            it++;
        }

        std::cout << "Total size: " << (double)(model_size+slot_size)/(1024*1024) << " MB" << std::endl;
        std::cout << "Model size: " << (double)model_size/(1024*1024) << " MB" << std::endl;
        std::cout << "Fill rate: " << (double)100*data_size/slot_size << "%" << std::endl;
    }